

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O1

bool hashSearch2<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,string *hash_str,string *map_name,string *default_value,uint8_t expansion,
               uint8_t reduction,bool nonKeyLookups)

{
  ushort uVar1;
  pointer pcVar2;
  pointer puVar3;
  iterator __position;
  string map_name_00;
  pointer pBVar4;
  pointer pBVar5;
  bool bVar6;
  bool bVar7;
  ushort uVar8;
  SeedType SVar9;
  size_t n1;
  size_t n2;
  undefined4 *puVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  __normal_iterator<Bin<unsigned_short>_*,_std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>_>
  __i;
  long lVar14;
  pointer pBVar15;
  unsigned_short *key;
  pointer __args;
  Bin<unsigned_short> *bin;
  bool bVar16;
  bool bVar17;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar18;
  undefined2 in_stack_fffffffffffffee6;
  vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> layer1;
  vector<bool,_std::allocator<bool>_> final_layer;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0 [2];
  long local_90 [2];
  string *local_80;
  string *local_78;
  size_type local_70;
  size_type local_68;
  string *local_60;
  ulong local_58;
  Bin<unsigned_short> *local_50;
  vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> local_48;
  
  uVar13 = (long)(keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 1;
  local_80 = hash_str;
  local_78 = default_value;
  local_60 = map_name;
  if (uVar13 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdc,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  bVar6 = hasDuplicates<unsigned_short>(keys);
  if (bVar6) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdd,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  if ((long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 != uVar13) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xde,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  n1 = getModulusBitmask((uVar13 * expansion) / (ulong)reduction);
  n2 = getModulusBitmask((long)(keys->
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(keys->
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 1);
  local_68 = n1 + 1;
  bVar6 = local_68 == 0;
  local_70 = n2 + 1;
  uVar18 = CONCAT13(1,(int3)in_stack_fffffffffffffee0);
  local_58 = 0;
  do {
    uVar8 = (ushort)(byte)(&DAT_001178e0)[local_58];
    local_c0 = local_b0;
    pcVar2 = (local_60->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar2,pcVar2 + local_60->_M_string_length);
    std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::vector
              (&layer1,local_68,(allocator_type *)&final_layer);
    puVar10 = (undefined4 *)
              CONCAT71(layer1.
                       super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                       layer1.
                       super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_1_);
    lVar11 = 0;
    do {
      *puVar10 = (int)lVar11;
      lVar11 = lVar11 + 1;
      puVar10 = puVar10 + 8;
    } while (n1 + 1 + (ulong)bVar6 != lVar11);
    puVar3 = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__args = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar5 = layer1.
                 super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish, __args != puVar3; __args = __args + 1) {
      uVar1 = *__args;
      uVar12 = (uint)uVar8 * (uint)(ushort)(uVar1 >> 7 ^ uVar1);
      lVar11 = CONCAT71(layer1.
                        super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        layer1.
                        super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_1_) +
               (ulong)((uint)n1 & (uVar12 >> 7 ^ uVar12)) * 0x20;
      __position._M_current = *(unsigned_short **)(lVar11 + 0x10);
      if (__position._M_current == *(unsigned_short **)(lVar11 + 0x18)) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)(lVar11 + 8),__position,
                   __args);
      }
      else {
        *__position._M_current = uVar1;
        *(unsigned_short **)(lVar11 + 0x10) = __position._M_current + 1;
      }
    }
    pBVar4 = (pointer)CONCAT71(layer1.
                               super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               layer1.
                               super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pBVar4 != layer1.
                  super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      lVar14 = (long)layer1.
                     super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar4;
      uVar13 = lVar14 >> 5;
      lVar11 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                (pBVar4,layer1.
                        super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e)
      ;
      if (lVar14 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                  (pBVar4,pBVar5);
      }
      else {
        pBVar15 = pBVar4 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                  (pBVar4,pBVar15);
        for (; pBVar15 != pBVar5; pBVar15 = pBVar15 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,__gnu_cxx::__ops::_Val_comp_iter<testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                    (pBVar15);
        }
      }
    }
    uVar13 = *(long *)(CONCAT71(layer1.
                                super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                layer1.
                                super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x10) -
             *(long *)(CONCAT71(layer1.
                                super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                layer1.
                                super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8);
    bVar16 = true;
    if (uVar13 != 2) {
      if (uVar13 < 0x13) {
        local_48.super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&final_layer,local_70,(bool *)&local_48,
                   (allocator_type *)&stack0xfffffffffffffee7);
        bin = (Bin<unsigned_short> *)
              CONCAT71(layer1.
                       super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                       layer1.
                       super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_1_);
        local_50 = layer1.
                   super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        bVar16 = bin == layer1.
                        super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
        while (!bVar16) {
          bin->seed = 0;
          bVar17 = true;
          do {
            bVar7 = testSeed<unsigned_short>(bin,n2,&final_layer);
            if (bVar7) break;
            SVar9 = (short)*(undefined4 *)&bin->seed + 1;
            bin->seed = SVar9;
            bVar17 = SVar9 != 0xffff;
          } while (bVar17);
          if (!bVar17) goto LAB_0010d5b3;
          bin = bin + 1;
          bVar16 = bin == local_50;
        }
        std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::vector
                  (&local_48,&layer1);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,local_c0,local_b8 + (long)local_c0);
        map_name_00._M_string_length = (size_type)local_78;
        map_name_00._M_dataplus._M_p = (pointer)local_a0;
        map_name_00.field_2._M_local_buf[0] = nonKeyLookups;
        map_name_00.field_2._M_allocated_capacity._1_7_ = 0;
        map_name_00.field_2._8_8_ = in_stack_fffffffffffffed8;
        writeHash2<unsigned_short>
                  (keys,(SeedType *)&stack0xfffffffffffffee4,n1,n2,vals,&local_48,local_80,
                   map_name_00,(string *)CONCAT26(in_stack_fffffffffffffee6,CONCAT24(uVar8,uVar18)),
                   (bool)layer1.
                         super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::~vector(&local_48);
LAB_0010d5b3:
        if (final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
      }
      else {
        bVar16 = false;
      }
    }
    std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::~vector(&layer1);
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
    if (bVar16) break;
    bVar16 = local_58 < 0x1f;
    local_58 = local_58 + 1;
    uVar18 = CONCAT13(bVar16,(int3)uVar18);
  } while (local_58 != 0x20);
  return (bool)((byte)((uint)uVar18 >> 0x18) & 1);
}

Assistant:

bool hashSearch2(const std::vector<KeyType>& keys,
                 const std::vector<std::string>& vals,
                 std::string& hash_str,
                 std::string map_name = "PoifectMap",
                 std::string default_value = "",
                 uint8_t expansion = 1,
                 uint8_t reduction = 1,
                 bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    const size_t n1 = getModulusBitmask(keys.size()*expansion/reduction);
    const size_t n2 = getModulusBitmask(keys.size());

    const uint8_t primes[32] = {  0,   1,   2,   3,   5,
                                  7,  11,  13,  17,  19,
                                 23,  29,  31,  37,  41,
                                 43,  47,  53,  59,  61,
                                 67,  71,  73,  79,  83,
                                 89,  97, 101, 103, 107,
                                109, 113};

    for(SeedType seed = 0; seed < 32; seed++)
        if(testSeed<KeyType>(keys, primes[seed], n1, n2, vals, hash_str, map_name, default_value, nonKeyLookups))
            return true;

    return false;
}